

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator==
               (Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  stored_size_type sVar1;
  stored_size_type sVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  bool bVar9;
  
  bVar5 = true;
  if (c1 != c2) {
    sVar1 = (c1->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    sVar2 = (c2->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar1 == sVar2) {
      if (sVar2 != 0 && sVar1 != 0) {
        lVar6 = 0;
        do {
          plVar7 = (long *)((long)(c1->column_).
                                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                                  .super_type.m_holder.m_start + lVar6);
          if ((plVar7 == (long *)0x0) ||
             (plVar8 = (long *)((long)(c2->column_).
                                      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                                      .super_type.m_holder.m_start + lVar6), plVar8 == (long *)0x0))
          {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                          "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, IsConst = true]"
                         );
          }
          lVar3 = *plVar7;
          lVar4 = *plVar8;
          if ((*(int *)(lVar3 + 8) != *(int *)(lVar4 + 8)) ||
             (*(int *)(lVar3 + 4) != *(int *)(lVar4 + 4))) goto LAB_00186f8b;
        } while ((sVar1 * 8 + -8 != lVar6) &&
                (bVar9 = sVar2 * 8 + -8 != lVar6, lVar6 = lVar6 + 8, bVar9));
      }
    }
    else {
LAB_00186f8b:
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool operator==(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return true;
    if (c1.column_.size() != c2.column_.size()) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_row_index() != (*it2)->get_row_index()) return false;
      } else {
        if ((*it1)->get_row_index() != (*it2)->get_row_index() || (*it1)->get_element() != (*it2)->get_element())
          return false;
      }
      ++it1;
      ++it2;
    }
    return true;
  }